

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O1

void QtPrivate::q_relocate_overlap_n_left_move<std::reverse_iterator<LibrarySearchPath*>,long_long>
               (reverse_iterator<LibrarySearchPath_*> first,longlong n,
               reverse_iterator<LibrarySearchPath_*> d_first)

{
  LibrarySearchPath *pLVar1;
  Data *pDVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  int *piVar6;
  LibrarySearchPath *pLVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  LibrarySearchPath *pLVar10;
  LibrarySearchPath *pLVar11;
  long in_FS_OFFSET;
  Destructor local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.end.current =
       (LibrarySearchPath *)((d_first.current)->super_QMakeLocalFileName).real_name.d.d;
  pLVar10 = local_38.end.current + -n;
  pLVar1 = (LibrarySearchPath *)((first.current)->super_QMakeLocalFileName).real_name.d.d;
  pLVar11 = pLVar1;
  pLVar7 = pLVar10;
  if (pLVar10 < pLVar1) {
    pLVar11 = pLVar10;
    pLVar7 = pLVar1;
  }
  pLVar1 = (LibrarySearchPath *)((d_first.current)->super_QMakeLocalFileName).real_name.d.d;
  while (pLVar1 != pLVar7) {
    pDVar2 = ((first.current)->super_QMakeLocalFileName).real_name.d.d;
    pDVar3 = (Data *)pDVar2[-4].super_QArrayData.alloc;
    pDVar2[-4].super_QArrayData.alloc = 0;
    pLVar1[-1].super_QMakeLocalFileName.real_name.d.d = pDVar3;
    pcVar4 = *(char16_t **)&pDVar2[-3].super_QArrayData;
    pDVar2[-3].super_QArrayData.ref_ = (Type)0x0;
    pDVar2[-3].super_QArrayData.flags = (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0x0;
    pLVar1[-1].super_QMakeLocalFileName.real_name.d.ptr = pcVar4;
    qVar5 = pDVar2[-3].super_QArrayData.alloc;
    pDVar2[-3].super_QArrayData.alloc = 0;
    pLVar1[-1].super_QMakeLocalFileName.real_name.d.size = qVar5;
    pDVar3 = *(Data **)&pDVar2[-2].super_QArrayData;
    pDVar2[-2].super_QArrayData.ref_ = (Type)0x0;
    pDVar2[-2].super_QArrayData.flags = (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0x0;
    pLVar1[-1].super_QMakeLocalFileName.local_name.d.d = pDVar3;
    pcVar4 = (char16_t *)pDVar2[-2].super_QArrayData.alloc;
    pDVar2[-2].super_QArrayData.alloc = 0;
    pLVar1[-1].super_QMakeLocalFileName.local_name.d.ptr = pcVar4;
    qVar5 = *(qsizetype *)&pDVar2[-1].super_QArrayData;
    pDVar2[-1].super_QArrayData.ref_ = (Type)0x0;
    pDVar2[-1].super_QArrayData.flags = (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0x0;
    pLVar1[-1].super_QMakeLocalFileName.local_name.d.size = qVar5;
    pLVar1[-1]._default = SUB81(pDVar2[-1].super_QArrayData.alloc,0);
    ((d_first.current)->super_QMakeLocalFileName).real_name.d.d =
         (Data *)&((d_first.current)->super_QMakeLocalFileName).real_name.d.d[-4].super_QArrayData.
                  alloc;
    ((first.current)->super_QMakeLocalFileName).real_name.d.d =
         (Data *)&((first.current)->super_QMakeLocalFileName).real_name.d.d[-4].super_QArrayData.
                  alloc;
    pLVar1 = (LibrarySearchPath *)((d_first.current)->super_QMakeLocalFileName).real_name.d.d;
  }
  local_38.iter = &local_38.end;
  local_38.intermediate.current =
       (LibrarySearchPath *)((d_first.current)->super_QMakeLocalFileName).real_name.d.d;
  while (pLVar1 = (LibrarySearchPath *)((d_first.current)->super_QMakeLocalFileName).real_name.d.d,
        pLVar1 != pLVar10) {
    pDVar2 = ((first.current)->super_QMakeLocalFileName).real_name.d.d;
    pDVar3 = pLVar1[-1].super_QMakeLocalFileName.real_name.d.d;
    pLVar1[-1].super_QMakeLocalFileName.real_name.d.d = (Data *)pDVar2[-4].super_QArrayData.alloc;
    pDVar2[-4].super_QArrayData.alloc = (qsizetype)pDVar3;
    pcVar4 = pLVar1[-1].super_QMakeLocalFileName.real_name.d.ptr;
    pLVar1[-1].super_QMakeLocalFileName.real_name.d.ptr = *(char16_t **)&pDVar2[-3].super_QArrayData
    ;
    *(char16_t **)&pDVar2[-3].super_QArrayData = pcVar4;
    qVar5 = pLVar1[-1].super_QMakeLocalFileName.real_name.d.size;
    pLVar1[-1].super_QMakeLocalFileName.real_name.d.size = pDVar2[-3].super_QArrayData.alloc;
    pDVar2[-3].super_QArrayData.alloc = qVar5;
    pDVar3 = pLVar1[-1].super_QMakeLocalFileName.local_name.d.d;
    pLVar1[-1].super_QMakeLocalFileName.local_name.d.d = *(Data **)&pDVar2[-2].super_QArrayData;
    *(Data **)&pDVar2[-2].super_QArrayData = pDVar3;
    pcVar4 = pLVar1[-1].super_QMakeLocalFileName.local_name.d.ptr;
    pLVar1[-1].super_QMakeLocalFileName.local_name.d.ptr =
         (char16_t *)pDVar2[-2].super_QArrayData.alloc;
    pDVar2[-2].super_QArrayData.alloc = (qsizetype)pcVar4;
    uVar8 = *(undefined4 *)&pLVar1[-1].super_QMakeLocalFileName.local_name.d.size;
    uVar9 = *(undefined4 *)((long)&pLVar1[-1].super_QMakeLocalFileName.local_name.d.size + 4);
    pLVar1[-1].super_QMakeLocalFileName.local_name.d.size =
         *(qsizetype *)&pDVar2[-1].super_QArrayData;
    pDVar2[-1].super_QArrayData.ref_ = (QBasicAtomicInt)uVar8;
    pDVar2[-1].super_QArrayData.flags = (ArrayOptions)uVar9;
    pLVar1[-1]._default = SUB81(pDVar2[-1].super_QArrayData.alloc,0);
    ((d_first.current)->super_QMakeLocalFileName).real_name.d.d =
         (Data *)&((d_first.current)->super_QMakeLocalFileName).real_name.d.d[-4].super_QArrayData.
                  alloc;
    ((first.current)->super_QMakeLocalFileName).real_name.d.d =
         (Data *)&((first.current)->super_QMakeLocalFileName).real_name.d.d[-4].super_QArrayData.
                  alloc;
  }
  while (pLVar1 = (LibrarySearchPath *)((first.current)->super_QMakeLocalFileName).real_name.d.d,
        pLVar1 != pLVar11) {
    ((first.current)->super_QMakeLocalFileName).real_name.d.d = (Data *)(pLVar1 + 1);
    pDVar2 = (pLVar1->super_QMakeLocalFileName).local_name.d.d;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
      UNLOCK();
      if ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
        QArrayData::deallocate
                  (&((pLVar1->super_QMakeLocalFileName).local_name.d.d)->super_QArrayData,2,0x10);
      }
    }
    piVar6 = *(int **)&(pLVar1->super_QMakeLocalFileName).real_name.d.d;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        QArrayData::deallocate
                  (*(QArrayData **)&(pLVar1->super_QMakeLocalFileName).real_name.d.d,2,0x10);
      }
    }
  }
  q_relocate_overlap_n_left_move<std::reverse_iterator<LibrarySearchPath_*>,_long_long>::Destructor
  ::~Destructor(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}